

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::ShaderAtomicXorCase::getInputs
          (ShaderAtomicXorCase *this,int numValues,int stride,void *inputs)

{
  uint uVar1;
  deUint32 dVar2;
  int iVar3;
  deBool dVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  Random rnd;
  deRandom local_40;
  
  dVar2 = deStringHash((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar2);
  iVar3 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1];
  uVar1 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2];
  uVar5 = iVar3 * uVar1;
  if (0 < (int)((long)numValues / (long)(int)uVar5)) {
    uVar6 = 0;
    iVar8 = stride;
    do {
      dVar2 = deRandom_getUint32(&local_40);
      *(deUint32 *)((long)inputs + (long)(int)(uVar5 * (int)uVar6 * stride)) = dVar2;
      lVar9 = (ulong)uVar5 - 1;
      iVar7 = iVar8;
      if (1 < (int)uVar5) {
        do {
          dVar4 = deRandom_getBool(&local_40);
          *(uint *)((long)inputs + (long)iVar7) = -(uint)(dVar4 == 1);
          iVar7 = iVar7 + stride;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      uVar6 = uVar6 + 1;
      iVar8 = iVar8 + iVar3 * uVar1 * stride;
    } while (uVar6 != ((long)numValues / (long)(int)uVar5 & 0xffffffffU));
  }
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		de::Random		rnd				(deStringHash(getName()));
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int groupOffset = groupNdx*workGroupSize;

			// First uses random bit-pattern.
			*(deUint32*)((deUint8*)inputs + stride*(groupOffset)) = rnd.getUint32();

			// Rest have either all or no bits set.
			for (int localNdx = 1; localNdx < workGroupSize; localNdx++)
				*(deUint32*)((deUint8*)inputs + stride*(groupOffset+localNdx)) = rnd.getBool() ? ~0u : 0u;
		}
	}